

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstate.c
# Opt level: O1

void f_luaopen(lua_State *L,void *ud)

{
  global_State *pgVar1;
  Table *t;
  lua_State *x__1;
  Table *x_;
  Value local_40;
  undefined1 local_38;
  
  pgVar1 = L->l_G;
  stack_init(L,L);
  t = luaH_new(L);
  (pgVar1->l_registry).value_.gc = (GCObject *)t;
  (pgVar1->l_registry).tt_ = 'E';
  luaH_resize(L,t,3,0);
  local_38 = 1;
  luaH_setint(L,t,1,(TValue *)&local_40);
  local_38 = 0x48;
  local_40 = (Value)L;
  luaH_setint(L,t,3,(TValue *)&local_40);
  local_40.gc = (GCObject *)luaH_new(L);
  local_38 = 0x45;
  luaH_setint(L,t,2,(TValue *)&local_40);
  luaS_init(L);
  luaT_init(L);
  luaX_init(L);
  pgVar1->gcstp = '\0';
  (pgVar1->nilvalue).tt_ = '\0';
  return;
}

Assistant:

static void f_luaopen (lua_State *L, void *ud) {
  global_State *g = G(L);
  UNUSED(ud);
  stack_init(L, L);  /* init stack */
  init_registry(L, g);
  luaS_init(L);
  luaT_init(L);
  luaX_init(L);
  g->gcstp = 0;  /* allow gc */
  setnilvalue(&g->nilvalue);  /* now state is complete */
  luai_userstateopen(L);
}